

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O0

sysbvm_tuple_t sysbvm_filesystem_extension(sysbvm_context_t *context,sysbvm_tuple_t path)

{
  _Bool _Var1;
  size_t sVar2;
  ulong uStack_40;
  char separator;
  size_t i;
  size_t extensionStart;
  uint8_t *pathBytes;
  size_t pathSize;
  sysbvm_tuple_t path_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isBytes(path);
  context_local = (sysbvm_context_t *)path;
  if (_Var1) {
    sVar2 = sysbvm_tuple_getSizeInBytes(path);
    i = sVar2;
    for (uStack_40 = 0; uStack_40 < sVar2; uStack_40 = uStack_40 + 1) {
      if (*(char *)(path + 0x10 + uStack_40) == '.') {
        i = uStack_40;
      }
    }
    context_local =
         (sysbvm_context_t *)
         sysbvm_string_createWithString(context,sVar2 - i,(char *)(path + 0x10 + i));
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_filesystem_extension(sysbvm_context_t *context, sysbvm_tuple_t path)
{
    if(!sysbvm_tuple_isBytes(path))
        return path;

    size_t pathSize = sysbvm_tuple_getSizeInBytes(path);
    uint8_t *pathBytes = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(path)->bytes;
    size_t extensionStart = pathSize;
    for(size_t i = 0; i < pathSize; ++i)
    {
        char separator = pathBytes[i];
        if(separator == '.')
            extensionStart = i;
    }

    return sysbvm_string_createWithString(context, pathSize - extensionStart, (const char*)(pathBytes + extensionStart));
}